

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

cmValue __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  size_t __n;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  cmState *this_01;
  string *this_02;
  string local_38;
  
  __n = prop->_M_string_length;
  if ((__n == propLOCATION_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((prop->_M_dataplus)._M_p,propLOCATION_abi_cxx11_._M_dataplus._M_p,__n),
      iVar2 == 0)))) {
    if ((this->FullPath)._M_string_length != 0) {
      return (cmValue)&this->FullPath;
    }
    return (cmValue)(string *)0x0;
  }
  if ((__n == propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((prop->_M_dataplus)._M_p,propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n
                   ), iVar2 == 0)))) {
    if ((this->IncludeDirectories).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->IncludeDirectories).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
        GetProperty();
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_38,&this->IncludeDirectories);
      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
LAB_0032c3b2:
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return (cmValue)this_02;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return (cmValue)this_02;
    }
  }
  else if ((__n == propCOMPILE_OPTIONS_abi_cxx11_._M_string_length) &&
          ((__n == 0 ||
           (iVar2 = bcmp((prop->_M_dataplus)._M_p,propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,
                         __n), iVar2 == 0)))) {
    if ((this->CompileOptions).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->CompileOptions).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
        GetProperty();
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_38,&this->CompileOptions);
      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
      goto LAB_0032c3b2;
    }
  }
  else if ((__n == propCOMPILE_DEFINITIONS_abi_cxx11_._M_string_length) &&
          ((__n == 0 ||
           (iVar2 = bcmp((prop->_M_dataplus)._M_p,
                         propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0)))) {
    if ((this->CompileDefinitions).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->CompileDefinitions).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
        GetProperty();
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&local_38,&this->CompileDefinitions);
      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
      goto LAB_0032c3b2;
    }
  }
  else {
    cVar3 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if (cVar3.Value != (string *)0x0) {
      return (cmValue)cVar3.Value;
    }
    this_00 = (this->Location).Makefile;
    this_01 = cmMakefile::GetState(this_00);
    bVar1 = cmState::IsPropertyChained(this_01,prop,SOURCE_FILE);
    if (bVar1) {
      cVar3 = cmMakefile::GetProperty(this_00,prop,true);
      return (cmValue)cVar3.Value;
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if (prop == propLOCATION) {
    if (this->FullPath.empty()) {
      return nullptr;
    }
    return cmValue(this->FullPath);
  }

  // Check for the properties with backtraces.
  if (prop == propINCLUDE_DIRECTORIES) {
    if (this->IncludeDirectories.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->IncludeDirectories);
    return cmValue(output);
  }

  if (prop == propCOMPILE_OPTIONS) {
    if (this->CompileOptions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->CompileOptions);
    return cmValue(output);
  }

  if (prop == propCOMPILE_DEFINITIONS) {
    if (this->CompileDefinitions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->CompileDefinitions);
    return cmValue(output);
  }

  cmValue retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain =
      mf->GetState()->IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain) {
      return mf->GetProperty(prop, chain);
    }
    return nullptr;
  }

  return retVal;
}